

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void glibr(void)

{
  obj *poVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  char *local_60;
  char *local_48;
  char *local_40;
  char *thiswep;
  char *otherwep;
  boolean rightfall;
  boolean leftfall;
  int xfl;
  obj *otmp;
  
  otherwep._4_4_ = 0;
  thiswep = (char *)0x0;
  bVar6 = false;
  if (((uleft != (obj *)0x0) && (bVar6 = false, (*(uint *)&uleft->field_0x4a & 1) == 0)) &&
     (bVar6 = true, uwep != (obj *)0x0)) {
    iVar2 = welded(uwep);
    bVar6 = true;
    if (iVar2 != 0) {
      if ((uwep->oclass == '\x02') || (bVar6 = false, uwep->oclass == '\x06')) {
        bVar6 = (*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0;
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
  }
  bVar7 = false;
  if ((uright != (obj *)0x0) && (bVar7 = false, (*(uint *)&uright->field_0x4a & 1) == 0)) {
    iVar2 = welded(uwep);
    bVar7 = iVar2 == 0;
  }
  if ((uarmg == (obj *)0x0) &&
     (((bVar6 || (bVar7)) && (((youmonst.data)->mflags1 & 0x6000) != 0x6000)))) {
    pcVar3 = "ring slips";
    if (bVar6 && bVar7) {
      pcVar3 = "rings slip";
    }
    if ((bVar6) && (bVar7)) {
      pcVar4 = body_part(3);
      local_40 = makeplural(pcVar4);
    }
    else {
      local_40 = body_part(3);
    }
    pline("Your %s off your %s.",pcVar3,local_40);
    poVar1 = uleft;
    otherwep._4_4_ = 1;
    if (bVar6) {
      Ring_off(uleft);
      dropx(poVar1);
    }
    poVar1 = uright;
    if (bVar7) {
      Ring_off(uright);
      dropx(poVar1);
    }
  }
  poVar1 = uswapwep;
  if ((u.twoweap != '\0') && (uswapwep != (obj *)0x0)) {
    if ((uswapwep->oclass == '\x02') &&
       (('\x04' < objects[uswapwep->otyp].oc_subtyp && (objects[uswapwep->otyp].oc_subtyp < '\v'))))
    {
      local_48 = "sword";
    }
    else {
      local_48 = makesingular(oclass_names[(int)uswapwep->oclass]);
    }
    thiswep = local_48;
    pcVar3 = "";
    if (otherwep._4_4_ != 0) {
      pcVar3 = "also ";
    }
    pcVar4 = body_part(6);
    pcVar4 = makeplural(pcVar4);
    pline("Your %s %sslips from your %s.",local_48,pcVar3,pcVar4);
    setuswapwep((obj *)0x0);
    otherwep._4_4_ = otherwep._4_4_ + 1;
    if ((poVar1->otyp != 0x210) || ((*(uint *)&poVar1->field_0x4a & 1) == 0)) {
      dropx(poVar1);
    }
  }
  poVar1 = uwep;
  if ((uwep != (obj *)0x0) && (iVar2 = welded(uwep), iVar2 == 0)) {
    if ((poVar1->oclass == '\x02') &&
       (('\x04' < objects[poVar1->otyp].oc_subtyp && (objects[poVar1->otyp].oc_subtyp < '\v')))) {
      local_60 = "sword";
    }
    else {
      local_60 = makesingular(oclass_names[(int)poVar1->oclass]);
    }
    if ((thiswep != (char *)0x0) && (iVar2 = strcmp(local_60,thiswep), iVar2 != 0)) {
      thiswep = (char *)0x0;
    }
    pcVar3 = "";
    if (thiswep != (char *)0x0) {
      pcVar3 = "other ";
    }
    pcVar4 = "";
    if (otherwep._4_4_ != 0) {
      pcVar4 = "also ";
    }
    pcVar5 = body_part(6);
    pcVar5 = makeplural(pcVar5);
    pline("Your %s%s %sslips from your %s.",pcVar3,local_60,pcVar4,pcVar5);
    setuwep((obj *)0x0);
    if ((poVar1->otyp != 0x210) || ((*(uint *)&poVar1->field_0x4a & 1) == 0)) {
      dropx(poVar1);
    }
  }
  return;
}

Assistant:

void glibr(void)
{
	struct obj *otmp;
	int xfl = 0;
	boolean leftfall, rightfall;
	const char *otherwep = 0;

	leftfall = (uleft && !uleft->cursed &&
		    (!uwep || !welded(uwep) || !bimanual(uwep)));
	rightfall = (uright && !uright->cursed && (!welded(uwep)));
	if (!uarmg && (leftfall || rightfall) && !nolimbs(youmonst.data)) {
		/* changed so cursed rings don't fall off, GAN 10/30/86 */
		pline("Your %s off your %s.",
			(leftfall && rightfall) ? "rings slip" : "ring slips",
			(leftfall && rightfall) ? makeplural(body_part(FINGER)) :
			body_part(FINGER));
		xfl++;
		if (leftfall) {
			otmp = uleft;
			Ring_off(uleft);
			dropx(otmp);
		}
		if (rightfall) {
			otmp = uright;
			Ring_off(uright);
			dropx(otmp);
		}
	}

	otmp = uswapwep;
	if (u.twoweap && otmp) {
		otherwep = is_sword(otmp) ? c_sword :
		    makesingular(oclass_names[(int)otmp->oclass]);
		pline("Your %s %sslips from your %s.",
			otherwep,
			xfl ? "also " : "",
			makeplural(body_part(HAND)));
		setuswapwep(NULL);
		xfl++;
		if (otmp->otyp != LOADSTONE || !otmp->cursed)
			dropx(otmp);
	}
	otmp = uwep;
	if (otmp && !welded(otmp)) {
		const char *thiswep;

		/* nice wording if both weapons are the same type */
		thiswep = is_sword(otmp) ? c_sword :
		    makesingular(oclass_names[(int)otmp->oclass]);
		if (otherwep && strcmp(thiswep, otherwep)) otherwep = 0;

		/* changed so cursed weapons don't fall, GAN 10/30/86 */
		pline("Your %s%s %sslips from your %s.",
			otherwep ? "other " : "", thiswep,
			xfl ? "also " : "",
			makeplural(body_part(HAND)));
		setuwep(NULL);
		if (otmp->otyp != LOADSTONE || !otmp->cursed)
			dropx(otmp);
	}
}